

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::z_formatter<spdlog::details::null_scoped_padder>::format
          (z_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  undefined8 in_RAX;
  char *value;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar1 = get_cached_offset(this,msg,tm_time);
  if ((int)uVar1 < 0) {
    uVar1 = -uVar1;
    value = (char *)((long)&uStack_18 + 7);
    uStack_18 = CONCAT17(0x2d,(undefined7)uStack_18);
  }
  else {
    value = (char *)((long)&uStack_18 + 6);
    uStack_18._0_7_ = CONCAT16(0x2b,(undefined6)uStack_18);
  }
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,value);
  fmt_helper::pad2(uVar1 / 0x3c,dest);
  uStack_18._0_6_ = CONCAT15(0x3a,(undefined5)uStack_18);
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)((long)&uStack_18 + 5))
  ;
  fmt_helper::pad2(uVar1 % 0x3c,dest);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }